

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall vera::Scene::update(Scene *this)

{
  bool bVar1;
  mapped_type *ppTVar2;
  pointer ppVar3;
  _Self local_70;
  _Self local_68;
  iterator it_1;
  _Self local_58;
  _Self local_50;
  iterator it;
  allocator local_31;
  key_type local_30;
  Scene *local_10;
  Scene *this_local;
  
  local_10 = this;
  if (((this->m_skybox).change & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_30,"default",&local_31);
    ppTVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureCube_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureCube_*>_>_>
              ::operator[](&this->cubemaps,&local_30);
    (*((*ppTVar2)->super_Texture)._vptr_Texture[0x10])
              (*ppTVar2,&this->m_skybox,(ulong)(uint)this->m_skyboxSize,
               (ulong)(this->m_skyboxFlip & 1));
    std::__cxx11::string::~string((string *)&local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    (this->m_skybox).change = false;
  }
  if ((this->m_streamsPrevsChange & 1U) != 0) {
    this->m_streamsPrevsChange = false;
    local_50._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>_>
         ::begin(&this->streams);
    while( true ) {
      local_58._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>_>
           ::end(&this->streams);
      bVar1 = std::operator!=(&local_50,&local_58);
      if (!bVar1) break;
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>
               ::operator->(&local_50);
      (*(ppVar3->second->super_Texture)._vptr_Texture[0x13])();
      it_1._M_node = (_Base_ptr)
                     std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>
                     ::operator++(&local_50,0);
    }
  }
  local_68._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>_>
       ::begin(&this->streams);
  while( true ) {
    local_70._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>_>
         ::end(&this->streams);
    bVar1 = std::operator!=(&local_68,&local_70);
    if (!bVar1) break;
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>
             ::operator->(&local_68);
    (*(ppVar3->second->super_Texture)._vptr_Texture[0x22])();
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::TextureStream_*>_>
    ::operator++(&local_68);
  }
  return;
}

Assistant:

void Scene::update() {
    if (m_skybox.change) {
        cubemaps["default"]->load(&m_skybox, m_skyboxSize, m_skyboxFlip);
        m_skybox.change = false;
    }

    if (m_streamsPrevsChange) {
        m_streamsPrevsChange = false;
        for (TextureStreamsMap::iterator it = streams.begin(); it != streams.end(); it++)
            it->second->setPrevTextures(m_streamsPrevs);
    }

    for (TextureStreamsMap::iterator it = streams.begin(); it != streams.end(); ++it)
        it->second->update();
}